

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O1

void Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::SetAuxPtr
               (FunctionProxy *host,AuxPointerType e,void *ptr)

{
  Type *pTVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  long lVar5;
  bool bVar6;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *pAVar7;
  undefined4 *puVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint lineNumber;
  Type *pTVar12;
  char *addr;
  
  pAVar7 = (host->auxPtrs).ptr;
  if (pAVar7 == (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0) {
    AllocAuxPtrFix(host,'\x10');
    pAVar7 = (host->auxPtrs).ptr;
    if (pAVar7->count != '\x01') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                  ,0x67,"(count == _MaxCount)","count == _MaxCount");
      if (!bVar6) goto LAB_00780e75;
      *puVar8 = 0;
    }
    lVar5 = 0;
    bVar6 = true;
    do {
      bVar4 = bVar6;
      lVar9 = lVar5;
      if (!bVar4) goto LAB_00780cd1;
      if (pAVar7->offsets[lVar9 + -1] == e) break;
      lVar5 = 1;
      bVar6 = false;
    } while (pAVar7->offsets[lVar9 + -1] != Invalid);
    pTVar12 = pAVar7->ptrs + lVar9 + -3;
    Memory::Recycler::WBSetBit((char *)pTVar12);
    pTVar12->ptr = ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar12);
    pAVar7->offsets[lVar9 + -1] = e;
    if (bVar4) {
      return;
    }
LAB_00780cd1:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    lineNumber = 0xe6;
LAB_00780d12:
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,lineNumber,"(ret)","ret");
    if (bVar6) {
      *puVar8 = 0;
      return;
    }
LAB_00780e75:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  if (pAVar7->count == '\x01') {
    lVar5 = 0;
    bVar6 = true;
    do {
      bVar4 = bVar6;
      lVar9 = lVar5;
      if (!bVar4) goto LAB_00780bd6;
      if (pAVar7->offsets[lVar9 + -1] == e) break;
      lVar5 = 1;
      bVar6 = false;
    } while (pAVar7->offsets[lVar9 + -1] != Invalid);
    pTVar12 = pAVar7->ptrs + lVar9 + -3;
    Memory::Recycler::WBSetBit((char *)pTVar12);
    pTVar12->ptr = ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar12);
    pAVar7->offsets[lVar9 + -1] = e;
    if (bVar4) {
      return;
    }
LAB_00780bd6:
    AllocAuxPtrFix(host,' ');
  }
  pAVar7 = (host->auxPtrs).ptr;
  if (pAVar7->count == '\x03') {
    if (pAVar7->capacity == Invalid || pAVar7->capacity == e) {
      bVar6 = true;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      do {
        uVar10 = uVar11;
        bVar6 = uVar10 < 2;
        if (uVar10 == 2) goto LAB_00780d7c;
        uVar11 = uVar10 + 1;
      } while ((pAVar7->offsets[uVar10] != e) && (pAVar7->offsets[uVar10] != Invalid));
      bVar6 = uVar10 < 2;
    }
    pTVar12 = pAVar7->ptrs + (uVar11 - 3);
    Memory::Recycler::WBSetBit((char *)pTVar12);
    pTVar12->ptr = ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar12);
    pAVar7->offsets[uVar11 - 1] = e;
LAB_00780d7c:
    if (bVar6) {
      return;
    }
    AllocAuxPtr(host,'\x04');
  }
  pAVar7 = (host->auxPtrs).ptr;
  uVar11 = (ulong)pAVar7->offsets[e];
  if (uVar11 == 0xff) {
    bVar2 = pAVar7->count;
    if (bVar2 == pAVar7->capacity) {
      AllocAuxPtr(host,((host->auxPtrs).ptr)->count + '\x01');
      pAVar7 = (host->auxPtrs).ptr;
      uVar11 = (ulong)pAVar7->offsets[e];
      if (uVar11 != 0xff) goto LAB_00780db3;
      bVar2 = pAVar7->count;
      if (bVar2 == pAVar7->capacity) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        lineNumber = 0x107;
        goto LAB_00780d12;
      }
    }
    pAVar7->count = bVar2 + 1;
    pAVar7->offsets[e] = bVar2;
    pTVar1 = pAVar7->offsets + (ulong)bVar2 * 8 + -2;
  }
  else {
LAB_00780db3:
    pTVar1 = pAVar7->offsets + uVar11 * 8 + -2;
  }
  addr = (char *)(pTVar1 + 0x20);
  Memory::Recycler::WBSetBit(addr);
  *(void **)addr = ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  return;
}

Assistant:

void AuxPtrs<T, FieldsEnum>::SetAuxPtr(T* host, FieldsEnum e, void* ptr)
    {

        if (host->auxPtrs == nullptr)
        {
            AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtrFix(host, 16);
            bool ret = ((AuxPtrs16*)(void*)host->auxPtrs)->Set(e, ptr);
            Assert(ret);
            return;
        }
        if (host->auxPtrs->count == AuxPtrs16::MaxCount)
        {
            bool ret = ((AuxPtrs16*)(void*)host->auxPtrs)->Set(e, ptr);
            if (ret)
            {
                return;
            }
            else
            {
                AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtrFix(host, 32);
            }
        }
        if (host->auxPtrs->count == AuxPtrs32::MaxCount)
        {
            bool ret = ((AuxPtrs32*)(void*)host->auxPtrs)->Set(e, ptr);
            if (ret)
            {
                return;
            }
            else
            {
                AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtr(host, AuxPtrs32::MaxCount + 1);
            }
        }

        bool ret = host->auxPtrs->Set(e, ptr);
        if (!ret)
        {
            AuxPtrs<FunctionProxy, FieldsEnum>::AllocAuxPtr(host, host->auxPtrs->count + 1);
            ret = host->auxPtrs->Set(e, ptr);
            Assert(ret);
        }
    }